

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

uint LZ4_count(BYTE *pIn,BYTE *pMatch,BYTE *pInLimit)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = (int)pIn;
  if (pIn < pInLimit + -7) {
    do {
      if (*(ulong *)pMatch != *(ulong *)pIn) {
        uVar3 = *(ulong *)pIn ^ *(ulong *)pMatch;
        uVar1 = 0;
        if (uVar3 != 0) {
          for (; (uVar3 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
          }
        }
        pIn = (BYTE *)((long)pIn + (uVar1 >> 3 & 0x1fffffff));
        goto LAB_001586ce;
      }
      pIn = (BYTE *)((long)pIn + 8);
      pMatch = (BYTE *)((long)pMatch + 8);
    } while (pIn < pInLimit + -7);
  }
  if ((pIn < pInLimit + -3) && ((int)*(ulong *)pMatch == (int)*(ulong *)pIn)) {
    pIn = (BYTE *)((long)pIn + 4);
    pMatch = (BYTE *)((long)pMatch + 4);
  }
  if ((pIn < pInLimit + -1) && ((short)*(ulong *)pMatch == (short)*(ulong *)pIn)) {
    pIn = (BYTE *)((long)pIn + 2);
    pMatch = (BYTE *)((long)pMatch + 2);
  }
  if (pIn < pInLimit) {
    pIn = (BYTE *)((long)pIn + (ulong)((char)*(ulong *)pMatch == (char)*(ulong *)pIn));
  }
LAB_001586ce:
  return (int)pIn - iVar2;
}

Assistant:

static unsigned LZ4_count(const BYTE* pIn, const BYTE* pMatch, const BYTE* pInLimit)
{
    const BYTE* const pStart = pIn;

    while (likely(pIn<pInLimit-(STEPSIZE-1)))
    {
        size_t diff = LZ4_read_ARCH(pMatch) ^ LZ4_read_ARCH(pIn);
        if (!diff) { pIn+=STEPSIZE; pMatch+=STEPSIZE; continue; }
        pIn += LZ4_NbCommonBytes(diff);
        return (unsigned)(pIn - pStart);
    }

    if (LZ4_64bits()) if ((pIn<(pInLimit-3)) && (LZ4_read32(pMatch) == LZ4_read32(pIn))) { pIn+=4; pMatch+=4; }
    if ((pIn<(pInLimit-1)) && (LZ4_read16(pMatch) == LZ4_read16(pIn))) { pIn+=2; pMatch+=2; }
    if ((pIn<pInLimit) && (*pMatch == *pIn)) pIn++;
    return (unsigned)(pIn - pStart);
}